

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,TypeAliasType *type,string_view overrideName)

{
  Type *this_00;
  basic_string_view<char,_std::char_traits<char>_> *__svt;
  string downstreamOverrideName;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string local_30;
  
  local_40._M_str = overrideName._M_str;
  local_40._M_len = overrideName._M_len;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  if (local_40._M_len == 0) {
    if (((this->options).elideScopeNames == false) &&
       ((this->options).anonymousTypeStyle != FriendlyName)) {
      getLexicalPath_abi_cxx11_
                (&local_30,(ast *)(type->super_Type).super_Symbol.parentScope,(Scope *)0x0);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&local_30,&(type->super_Type).super_Symbol.name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_60,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      goto LAB_003eaa23;
    }
    __svt = &(type->super_Type).super_Symbol.name;
  }
  else {
    __svt = &local_40;
  }
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&local_60,__svt);
LAB_003eaa23:
  if ((this->options).skipTypeDefs == true) {
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,
               local_60._M_dataplus._M_p,local_60._M_dataplus._M_p + local_60._M_string_length);
  }
  else {
    this_00 = DeclaredType::getType(&type->targetType);
    Symbol::visit<slang::ast::TypePrinter&,std::__cxx11::string&>
              (&this_00->super_Symbol,this,&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void TypePrinter::visit(const TypeAliasType& type, std::string_view overrideName) {
    std::string downstreamOverrideName;
    if (!overrideName.empty()) {
        downstreamOverrideName = overrideName;
    }
    else if (options.elideScopeNames ||
             options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        downstreamOverrideName = type.name;
    }
    else {
        std::string path = getLexicalPath(type.getParentScope());
        path.append(type.name);
        downstreamOverrideName = path;
    }

    if (options.skipTypeDefs) {
        buffer->append(downstreamOverrideName);
    }
    else {
        type.targetType.getType().visit(*this, downstreamOverrideName);
    }
}